

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsDemuxer.cpp
# Opt level: O0

int __thiscall
TSDemuxer::simpleDemuxBlock
          (TSDemuxer *this,DemuxedData *demuxedData,PIDSet *acceptedPIDs,int64_t *discardSize)

{
  uint uVar1;
  uint32_t uVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  reference piVar9;
  undefined4 extraout_var;
  size_type sVar10;
  reference pvVar11;
  VodCoreException *this_00;
  mapped_type *pmVar12;
  pointer ppVar13;
  int64_t iVar14;
  int64_t iVar15;
  size_t num;
  uint8_t *puVar16;
  size_t sVar17;
  uint8_t *end;
  long local_1400;
  bool local_13d9;
  uint8_t *dst;
  int64_t payloadLen;
  int64_t pts_1;
  int64_t dts;
  int64_t pts;
  int64_t ptsBase;
  _Self local_1310;
  _Self local_1308;
  _Self local_1300;
  int64_t local_12f8;
  int64_t curDts;
  int64_t curPts;
  iterator streamInfo;
  PESPacket *pesPacket;
  _Base_ptr p_Stack_12d0;
  bool pesStartCode;
  uint8_t *frameData;
  TSPacket *pTStack_12c0;
  int pid_1;
  TSPacket *tsPacket_1;
  _Self local_12b0;
  undefined1 local_12a1;
  string local_12a0;
  ostringstream local_1280 [8];
  ostringstream ss;
  int local_10f4;
  TSPacket *pTStack_10f0;
  int pid;
  TSPacket *tsPacket;
  TS_program_association_section pat;
  bool forpmtm2tsHdrDiscarded;
  uint8_t *lastFrameAddr;
  uint8_t *data;
  uint uStack_1090;
  bool isFirstBlock;
  int readRez;
  uint32_t readedBytes;
  int acceptedPID_1;
  iterator __end1;
  iterator __begin1;
  PIDSet *__range1;
  mapped_type *pmStack_1068;
  int lastPid;
  MemoryBlock *vect;
  uint8_t local_1058 [4];
  int pmtBufferLen;
  uint8_t pmtBuffer [4096];
  iterator iStack_48;
  int acceptedPID;
  iterator __end2;
  iterator __begin2;
  PIDSet *__range2;
  int64_t *discardSize_local;
  PIDSet *acceptedPIDs_local;
  DemuxedData *demuxedData_local;
  TSDemuxer *this_local;
  
  if ((this->m_firstDemuxCall & 1U) != 0) {
    __end2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(acceptedPIDs);
    iStack_48 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(acceptedPIDs);
    while (bVar4 = std::operator!=(&__end2,&stack0xffffffffffffffb8), bVar4) {
      piVar9 = std::_Rb_tree_const_iterator<int>::operator*(&__end2);
      this->m_acceptedPidCache[*piVar9] = '\x01';
      std::_Rb_tree_const_iterator<int>::operator++(&__end2);
    }
    this->m_firstDemuxCall = false;
  }
  memset(local_1058,0,0x1000);
  vect._4_4_ = 0;
  pmStack_1068 = (MemoryBlock *)0x0;
  __range1._4_4_ = -1;
  __end1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(acceptedPIDs);
  _readedBytes = std::set<int,_std::less<int>,_std::allocator<int>_>::end(acceptedPIDs);
  while (bVar4 = std::operator!=(&__end1,(_Self *)&readedBytes), bVar4) {
    piVar9 = std::_Rb_tree_const_iterator<int>::operator*(&__end1);
    readRez = *piVar9;
    std::map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
    ::operator[](demuxedData,&readRez);
    std::_Rb_tree_const_iterator<int>::operator++(&__end1);
  }
  *discardSize = 0;
  data._4_4_ = 0;
  data._3_1_ = 0;
  iVar7 = (*this->m_bufferedReader->_vptr_AbstractReader[2])
                    (this->m_bufferedReader,(ulong)(uint)this->m_readerID,&stack0xffffffffffffef70,
                     (long)&data + 4,(long)&data + 3);
  if (data._4_4_ == 2) {
    this->m_lastReadRez = 2;
    this_local._4_4_ = 2;
  }
  else if (((ulong)uStack_1090 + this->m_tmpBufferLen == 0) ||
          ((uStack_1090 == 0 && (this->m_lastReadRez == 1)))) {
    this->m_lastReadRez = data._4_4_;
    this_local._4_4_ = 1;
  }
  else {
    if (uStack_1090 != 0) {
      (*this->m_bufferedReader->_vptr_AbstractReader[5])
                (this->m_bufferedReader,(ulong)(uint)this->m_readerID,(ulong)uStack_1090);
    }
    this->m_lastReadRez = data._4_4_;
    lastFrameAddr = (uint8_t *)(CONCAT44(extraout_var,iVar7) + 0xbc);
    if (0 < this->m_tmpBufferLen) {
      memcpy(lastFrameAddr + -this->m_tmpBufferLen,this->m_tmpBuffer,this->m_tmpBufferLen);
      lastFrameAddr = lastFrameAddr + -this->m_tmpBufferLen;
      uStack_1090 = (int)this->m_tmpBufferLen + uStack_1090;
      this->m_tmpBufferLen = 0;
    }
    if ((data._3_1_ & 1) != 0) {
      uVar1 = this->m_curFileNum;
      sVar10 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::size(&this->m_mplsInfo);
      if (uVar1 < sVar10) {
        pvVar11 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::operator[]
                            (&this->m_mplsInfo,(ulong)this->m_curFileNum);
        uVar2 = pvVar11->OUT_time;
        pvVar11 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::operator[]
                            (&this->m_mplsInfo,(ulong)this->m_curFileNum);
        this->m_prevFileLen = (ulong)(uVar2 - pvVar11->IN_time) * 2 + this->m_prevFileLen;
      }
      else if ((this->m_firstVideoPTS == -1) || (this->m_lastVideoPTS == -1)) {
        this->m_prevFileLen = (this->m_lastPTS - this->m_firstPTS) + this->m_prevFileLen;
      }
      else {
        this->m_prevFileLen =
             (this->m_lastVideoPTS - this->m_firstVideoPTS) + this->m_videoDtsGap +
             this->m_prevFileLen;
      }
      this->m_firstPTS = -1;
      this->m_lastPTS = -1;
      this->m_firstVideoPTS = -1;
      this->m_lastVideoPTS = -1;
      this->m_curFileNum = this->m_curFileNum + 1;
    }
    *discardSize = 0;
    if (uStack_1090 < 0xbc) {
      *discardSize = (ulong)uStack_1090 + *discardSize;
      this_local._4_4_ = 0;
    }
    else {
      end = lastFrameAddr + ((ulong)uStack_1090 - 0xbc);
      if (((this->m_firstCall & 1U) != 0) && ((this->m_m2tsMode & 1U) == 0)) {
        bVar4 = checkForRealM2ts(this,lastFrameAddr,end);
        this->m_m2tsMode = bVar4;
        this->m_firstCall = false;
      }
      pat.pmtPids._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
           this->m_m2tsHdrDiscarded & 1;
      bVar4 = std::
              map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
              ::empty(&(this->m_pmt).pidList);
      if ((bVar4) || (bVar4 = mvcContinueExpected(this), bVar4)) {
        TS_program_association_section::TS_program_association_section
                  ((TS_program_association_section *)&tsPacket);
        this->m_curPos = lastFrameAddr;
        while (this->m_curPos <= end) {
          if (((pat.pmtPids._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) &&
             ((this->m_m2tsMode & 1U) != 0)) {
            this->m_curPos = this->m_curPos + 4;
          }
          while( true ) {
            bVar4 = false;
            if (*this->m_curPos != 'G') {
              bVar4 = this->m_curPos <= end;
            }
            if (!bVar4) break;
            this->m_curPos = this->m_curPos + 1;
          }
          if (end < this->m_curPos) break;
          pat.pmtPids._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
          pTStack_10f0 = (TSPacket *)this->m_curPos;
          local_10f4 = TSPacket::getPID(pTStack_10f0);
          iVar7 = TSPacket::getHeaderSize(pTStack_10f0);
          if (0xbc < iVar7) {
            std::__cxx11::ostringstream::ostringstream(local_1280);
            std::operator<<((ostream *)local_1280,"Invalid tsPacket->getHeaderSize");
            local_12a1 = 1;
            this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
            std::__cxx11::ostringstream::str();
            VodCoreException::VodCoreException(this_00,3,&local_12a0);
            local_12a1 = 0;
            __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
          if (local_10f4 == 0) {
            puVar16 = this->m_curPos;
            iVar7 = TSPacket::getHeaderSize(pTStack_10f0);
            iVar8 = TSPacket::getHeaderSize(pTStack_10f0);
            TS_program_association_section::deserialize
                      ((TS_program_association_section *)&tsPacket,puVar16 + iVar7,0xbc - iVar8);
          }
          else {
            local_12b0._M_node =
                 (_Base_ptr)
                 std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 find((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &pat,&local_10f4);
            tsPacket_1 = (TSPacket *)
                         std::
                         map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         ::end((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                *)&pat);
            bVar4 = std::operator!=(&local_12b0,(_Self *)&tsPacket_1);
            if ((bVar4) && (((*(uint *)pTStack_10f0 >> 0xe & 1) != 0 || (0 < vect._4_4_)))) {
              iVar7 = TSPacket::getHeaderSize(pTStack_10f0);
              if (0x1000 < (vect._4_4_ + 0xbc) - iVar7) break;
              puVar16 = this->m_curPos;
              iVar7 = TSPacket::getHeaderSize(pTStack_10f0);
              iVar8 = TSPacket::getHeaderSize(pTStack_10f0);
              memcpy(local_1058 + vect._4_4_,puVar16 + iVar7,(long)(0xbc - iVar8));
              iVar7 = TSPacket::getHeaderSize(pTStack_10f0);
              vect._4_4_ = (vect._4_4_ - iVar7) + 0xbc;
              bVar4 = TS_program_map_section::isFullBuff(local_1058,vect._4_4_);
              if (bVar4) {
                TS_program_map_section::deserialize(&this->m_pmt,local_1058,vect._4_4_);
                if ((this->m_pmt).video_type != 0x20) {
                  this->m_nonMVCVideoFound = true;
                }
                vect._4_4_ = 0;
              }
            }
          }
          this->m_curPos = this->m_curPos + 0xbc;
        }
        TS_program_association_section::~TS_program_association_section
                  ((TS_program_association_section *)&tsPacket);
      }
      this->m_curPos = lastFrameAddr;
      while (this->m_curPos <= end) {
        if (((this->m_m2tsHdrDiscarded & 1U) == 0) && ((this->m_m2tsMode & 1U) != 0)) {
          *discardSize = *discardSize + 4;
          this->m_curPos = this->m_curPos + 4;
        }
        while( true ) {
          bVar4 = false;
          if (this->m_curPos <= end) {
            bVar4 = *this->m_curPos != 'G';
          }
          if (!bVar4) break;
          *discardSize = *discardSize + 1;
          this->m_curPos = this->m_curPos + 1;
        }
        if (end < this->m_curPos) {
          this->m_m2tsHdrDiscarded = true;
          break;
        }
        this->m_m2tsHdrDiscarded = false;
        pTStack_12c0 = (TSPacket *)this->m_curPos;
        frameData._4_4_ = TSPacket::getPID(pTStack_12c0);
        *discardSize = *discardSize + 0xbc;
        puVar16 = this->m_curPos;
        iVar7 = TSPacket::getHeaderSize(pTStack_12c0);
        p_Stack_12d0 = (_Base_ptr)(puVar16 + iVar7);
        bVar4 = false;
        if ((((char)p_Stack_12d0->_M_color == _S_red) &&
            (bVar4 = false, *(byte *)((long)&p_Stack_12d0->_M_color + 1) == 0)) &&
           (bVar4 = false, *(byte *)((long)&p_Stack_12d0->_M_color + 2) == 1)) {
          bVar4 = (*(uint *)pTStack_12c0 >> 0xe & 1) != 0;
        }
        if (bVar4) {
          streamInfo._M_node = p_Stack_12d0;
          curPts = (int64_t)std::
                            map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
                            ::find(&(this->m_pmt).pidList,
                                   (key_type_conflict *)((long)&frameData + 4));
          if (((streamInfo._M_node)->field_0x7 & 0x80) == 0x80) {
            local_12f8 = PESPacket::getPts((PESPacket *)streamInfo._M_node);
            curDts = local_12f8;
            if (((streamInfo._M_node)->field_0x7 & 0xc0) == 0xc0) {
              local_12f8 = PESPacket::getDts((PESPacket *)streamInfo._M_node);
            }
            if ((this->m_lastPTS == -1) || (this->m_lastPTS < curDts)) {
              this->m_lastPTS = curDts;
            }
            if ((this->m_firstPTS == -1) || (curDts < this->m_firstPTS)) {
              this->m_firstPTS = curDts;
            }
            local_1300._M_node =
                 (_Base_ptr)
                 std::
                 map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
                 ::end(&(this->m_pmt).pidList);
            bVar4 = std::operator!=((_Self *)&curPts,&local_1300);
            local_13d9 = false;
            if (bVar4) {
              ppVar13 = std::_Rb_tree_iterator<std::pair<const_int,_PMTStreamInfo>_>::operator->
                                  ((_Rb_tree_iterator<std::pair<const_int,_PMTStreamInfo>_> *)
                                   &curPts);
              local_13d9 = isVideoPID((ppVar13->second).m_streamType);
            }
            if (local_13d9 != false) {
              if ((this->m_firstVideoPTS == -1) || (curDts < this->m_firstVideoPTS)) {
                this->m_firstVideoPTS = curDts;
              }
              if (this->m_lastVideoPTS < curDts) {
                this->m_lastVideoPTS = curDts;
              }
              if (this->m_lastVideoDTS == -1) {
                this->m_lastVideoDTS = local_12f8;
              }
              if ((this->m_videoDtsGap == -1) && (this->m_lastVideoDTS < local_12f8)) {
                this->m_videoDtsGap = local_12f8 - this->m_lastVideoDTS;
              }
            }
            local_1308._M_node =
                 (_Base_ptr)
                 std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::
                 find(&this->m_firstPtsTime,(key_type_conflict *)((long)&frameData + 4));
            local_1310._M_node =
                 (_Base_ptr)
                 std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::
                 end(&this->m_firstPtsTime);
            bVar5 = std::operator==(&local_1308,&local_1310);
            iVar14 = curDts;
            bVar4 = true;
            if ((!bVar5) && (bVar4 = false, this->m_curFileNum == 0)) {
              pmVar12 = std::
                        map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
                        ::operator[](&this->m_firstPtsTime,
                                     (key_type_conflict *)((long)&frameData + 4));
              bVar4 = iVar14 < *pmVar12;
            }
            iVar14 = curDts;
            if (bVar4) {
              pmVar12 = std::
                        map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
                        ::operator[](&this->m_firstPtsTime,
                                     (key_type_conflict *)((long)&frameData + 4));
              *pmVar12 = iVar14;
            }
          }
          ptsBase = (int64_t)std::
                             map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
                             ::end(&(this->m_pmt).pidList);
          bVar5 = std::operator!=((_Self *)&curPts,(_Self *)&ptsBase);
          bVar4 = false;
          if (bVar5) {
            ppVar13 = std::_Rb_tree_iterator<std::pair<const_int,_PMTStreamInfo>_>::operator->
                                ((_Rb_tree_iterator<std::pair<const_int,_PMTStreamInfo>_> *)&curPts)
            ;
            bVar4 = (ppVar13->second).m_streamType != SUB_PGS;
          }
          if (bVar4) {
            bVar6 = PESPacket::getHeaderLength((PESPacket *)streamInfo._M_node);
            p_Stack_12d0 = (_Base_ptr)((long)&p_Stack_12d0->_M_color + (long)(int)(uint)bVar6);
          }
          else {
            if (this->m_firstVideoPTS == -1) {
              local_1400 = this->m_firstPTS;
            }
            else {
              local_1400 = this->m_firstVideoPTS;
            }
            if (((streamInfo._M_node)->field_0x7 & 0xc0) == 0xc0) {
              iVar14 = PESPacket::getPts((PESPacket *)streamInfo._M_node);
              lVar3 = this->m_prevFileLen;
              iVar15 = PESPacket::getDts((PESPacket *)streamInfo._M_node);
              PESPacket::setPtsAndDts
                        ((PESPacket *)streamInfo._M_node,(iVar14 - local_1400) + lVar3,
                         (iVar15 - local_1400) + this->m_prevFileLen);
            }
            else if (((streamInfo._M_node)->field_0x7 & 0x80) == 0x80) {
              iVar14 = PESPacket::getPts((PESPacket *)streamInfo._M_node);
              PESPacket::setPts((PESPacket *)streamInfo._M_node,
                                (iVar14 - local_1400) + this->m_prevFileLen);
            }
          }
        }
        if (this->m_acceptedPidCache[frameData._4_4_] != '\0') {
          num = 0xbc - ((long)p_Stack_12d0 - (long)this->m_curPos);
          if (0 < (long)num) {
            if (frameData._4_4_ != __range1._4_4_) {
              pmStack_1068 = std::
                             map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
                             ::operator[](demuxedData,(key_type_conflict *)((long)&frameData + 4));
              __range1._4_4_ = frameData._4_4_;
            }
            if (pmStack_1068 != (MemoryBlock *)0x0) {
              MemoryBlock::grow(pmStack_1068,num);
              puVar16 = MemoryBlock::data(pmStack_1068);
              sVar17 = MemoryBlock::size(pmStack_1068);
              memcpy(puVar16 + (sVar17 - num),p_Stack_12d0,num);
            }
          }
          *discardSize = *discardSize - num;
        }
        this->m_curPos = this->m_curPos + 0xbc;
      }
      if (this->m_curPos < lastFrameAddr + uStack_1090) {
        this->m_tmpBufferLen =
             (int64_t)(lastFrameAddr + ((ulong)uStack_1090 - (long)this->m_curPos));
        memmove(this->m_tmpBuffer,this->m_curPos,this->m_tmpBufferLen);
      }
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int TSDemuxer::simpleDemuxBlock(DemuxedData& demuxedData, const PIDSet& acceptedPIDs, int64_t& discardSize)
{
    if (m_firstDemuxCall)
    {
        for (const int acceptedPID : acceptedPIDs) m_acceptedPidCache[acceptedPID] = 1;
        m_firstDemuxCall = false;
    }

    uint8_t pmtBuffer[4096]{0};
    int pmtBufferLen = 0;
    MemoryBlock* vect = nullptr;
    int lastPid = -1;

    for (int acceptedPID : acceptedPIDs) demuxedData[acceptedPID];

    discardSize = 0;
    uint32_t readedBytes;
    int readRez = 0;
    bool isFirstBlock = false;
    uint8_t* data = m_bufferedReader->readBlock(m_readerID, readedBytes, readRez, &isFirstBlock);  // blocked read mode
    if (readRez == BufferedFileReader::DATA_NOT_READY)
    {
        m_lastReadRez = readRez;
        return BufferedFileReader::DATA_NOT_READY;
    }
    if (readedBytes + m_tmpBufferLen == 0 || (readedBytes == 0 && m_lastReadRez == BufferedReader::DATA_EOF))
    {
        m_lastReadRez = readRez;
        return BufferedReader::DATA_EOF;
    }
    if (readedBytes > 0)
        m_bufferedReader->notify(m_readerID, readedBytes);
    m_lastReadRez = readRez;
    data += TS_FRAME_SIZE;
    if (m_tmpBufferLen > 0)
    {
        memcpy(data - m_tmpBufferLen, m_tmpBuffer, m_tmpBufferLen);
        data -= m_tmpBufferLen;
        readedBytes += static_cast<uint32_t>(m_tmpBufferLen);
        m_tmpBufferLen = 0;
    }

    if (isFirstBlock)
    {
        if (m_curFileNum < m_mplsInfo.size())
            m_prevFileLen +=
                static_cast<int64_t>(m_mplsInfo[m_curFileNum].OUT_time - m_mplsInfo[m_curFileNum].IN_time) *
                2;  // in 90Khz clock
        else
        {
            if (m_firstVideoPTS != -1 && m_lastVideoPTS != -1)
                m_prevFileLen += (m_lastVideoPTS - m_firstVideoPTS + m_videoDtsGap);
            else  // no video file
                m_prevFileLen += (m_lastPTS - m_firstPTS);
        }
        m_firstPTS = -1;
        m_lastPTS = -1;
        m_firstVideoPTS = -1;
        m_lastVideoPTS = -1;
        m_curFileNum++;
    }

    discardSize = 0;

    if (readedBytes < TS_FRAME_SIZE)
    {
        discardSize += readedBytes;
        return 0;
    }

    const uint8_t* lastFrameAddr = data + readedBytes - TS_FRAME_SIZE;

    if (m_firstCall && !m_m2tsMode)
    {
        m_m2tsMode = checkForRealM2ts(data, lastFrameAddr);
        m_firstCall = false;
    }

    bool forpmtm2tsHdrDiscarded = m_m2tsHdrDiscarded;
    if (m_pmt.pidList.empty() || mvcContinueExpected())
    {
        TS_program_association_section pat;
        for (m_curPos = data; m_curPos <= lastFrameAddr; m_curPos += TS_FRAME_SIZE)
        {
            if (!forpmtm2tsHdrDiscarded && m_m2tsMode)
                m_curPos += 4;
            while (*m_curPos != 0x47 && m_curPos <= lastFrameAddr) m_curPos++;
            if (m_curPos > lastFrameAddr)
                break;
            forpmtm2tsHdrDiscarded = false;

            const auto tsPacket = reinterpret_cast<TSPacket*>(m_curPos);
            int pid = tsPacket->getPID();
            if (TS_FRAME_SIZE < tsPacket->getHeaderSize())
            {
                THROW(ERR_COMMON, "Invalid tsPacket->getHeaderSize")
                break;
            }
            if (pid == 0)
            {  // PAT
                pat.deserialize(m_curPos + tsPacket->getHeaderSize(), TS_FRAME_SIZE - tsPacket->getHeaderSize());
            }
            else if (pat.pmtPids.find(pid) != pat.pmtPids.end())
            {  // PMT
                if (tsPacket->payloadStart || pmtBufferLen > 0)
                {
                    if (pmtBufferLen + TS_FRAME_SIZE - tsPacket->getHeaderSize() > 4096)
                        break;
                    memcpy(pmtBuffer + pmtBufferLen, m_curPos + tsPacket->getHeaderSize(),
                           TS_FRAME_SIZE - tsPacket->getHeaderSize());
                    pmtBufferLen += TS_FRAME_SIZE - tsPacket->getHeaderSize();
                    if (TS_program_map_section::isFullBuff(pmtBuffer, pmtBufferLen))
                    {
                        m_pmt.deserialize(pmtBuffer, pmtBufferLen);
                        if (m_pmt.video_type != static_cast<int>(StreamType::VIDEO_MVC))
                            m_nonMVCVideoFound = true;
                        pmtBufferLen = 0;
                    }
                }
            }
        }
    }

    for (m_curPos = data; m_curPos <= lastFrameAddr; m_curPos += TS_FRAME_SIZE)
    {
        if (!m_m2tsHdrDiscarded && m_m2tsMode)
        {
            discardSize += 4;
            m_curPos += 4;
        }
        while (m_curPos <= lastFrameAddr && *m_curPos != 0x47)
        {
            discardSize++;
            m_curPos++;
        }
        if (m_curPos > lastFrameAddr)
        {
            m_m2tsHdrDiscarded = true;
            break;
        }
        m_m2tsHdrDiscarded = false;

        const auto tsPacket = reinterpret_cast<TSPacket*>(m_curPos);
        int pid = tsPacket->getPID();
        discardSize += TS_FRAME_SIZE;

        // pcrFrames++;

        if (tsPacket->afExists)
        {
            if (tsPacket->adaptiveField.pcrExist)
            {
                // if (prevPCR == -1)
                //	prevPCR = tsPacket->adaptiveField.getPCR33();

                // prevPCR = tsPacket->adaptiveField.getPCR33();
                // LTRACE(LT_INFO, 2, "pcr: " << prevPCR - 55729419ll);
                // pcrFrames = 0;
            }
        }

        uint8_t* frameData = m_curPos + tsPacket->getHeaderSize();
        const bool pesStartCode = frameData[0] == 0 && frameData[1] == 0 && frameData[2] == 1 && tsPacket->payloadStart;
        if (pesStartCode)
        {
            const auto pesPacket = reinterpret_cast<PESPacket*>(frameData);
            auto streamInfo = m_pmt.pidList.find(pid);

            if ((pesPacket->flagsLo & 0x80) == 0x80)
            {
                const int64_t curPts = pesPacket->getPts();
                int64_t curDts = curPts;

                if ((pesPacket->flagsLo & 0xc0) == 0xc0)
                    curDts = pesPacket->getDts();

                if (m_lastPTS == -1 || curPts > m_lastPTS)
                    m_lastPTS = curPts;

                if (m_firstPTS == -1 || curPts < m_firstPTS)
                    m_firstPTS = curPts;

                if (streamInfo != m_pmt.pidList.end() && isVideoPID(streamInfo->second.m_streamType))
                {
                    if (m_firstVideoPTS == -1 || curPts < m_firstVideoPTS)
                        m_firstVideoPTS = curPts;
                    if (curPts > m_lastVideoPTS)
                        m_lastVideoPTS = curPts;
                    if (m_lastVideoDTS == -1)
                        m_lastVideoDTS = curDts;
                    if (m_videoDtsGap == -1 && curDts > m_lastVideoDTS)
                        m_videoDtsGap = curDts - m_lastVideoDTS;
                }

                if (m_firstPtsTime.find(pid) == m_firstPtsTime.end() ||
                    (m_curFileNum == 0 && curPts < m_firstPtsTime[pid]))
                    m_firstPtsTime[pid] = curPts;
            }

            if (streamInfo != m_pmt.pidList.end() &&
                streamInfo->second.m_streamType != StreamType::SUB_PGS)  // demux PGS with PES headers
                frameData += pesPacket->getHeaderLength();
            else
            {
                const int64_t ptsBase = m_firstVideoPTS != -1 ? m_firstVideoPTS : m_firstPTS;
                if ((pesPacket->flagsLo & 0xc0) == 0xc0)
                {
                    const int64_t pts = pesPacket->getPts() - ptsBase + m_prevFileLen;
                    const int64_t dts = pesPacket->getDts() - ptsBase + m_prevFileLen;
                    pesPacket->setPtsAndDts(pts, dts);
                }
                else if ((pesPacket->flagsLo & 0x80) == 0x80)
                {
                    const int64_t pts = pesPacket->getPts() - ptsBase + m_prevFileLen;
                    pesPacket->setPts(pts);
                }
            }
        }

        // if (acceptedPIDs.find(pid) == acceptedPIDs.end())
        if (!m_acceptedPidCache[pid])
            continue;

        const int64_t payloadLen = TS_FRAME_SIZE - (frameData - m_curPos);
        if (payloadLen > 0)
        {
            if (pid != lastPid)
            {
                vect = &demuxedData[pid];
                lastPid = pid;
            }
            if (vect != nullptr)
            {
                vect->grow(payloadLen);
                uint8_t* dst = vect->data() + vect->size() - payloadLen;
                memcpy(dst, frameData, payloadLen);
            }
        }
        discardSize -= payloadLen;
    }
    if (m_curPos < data + readedBytes)
    {
        m_tmpBufferLen = data + readedBytes - m_curPos;
        memmove(m_tmpBuffer, m_curPos, m_tmpBufferLen);
    }

    return 0;
}